

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddAndAbs.c
# Opt level: O1

DdNode * cuddBddAndAbstractRecur(DdManager *manager,DdNode *f,DdNode *g,DdNode *cube)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int *piVar4;
  bool bVar5;
  DdNode *pDVar6;
  abctime aVar7;
  DdNode *pDVar8;
  DdNode *pDVar9;
  uint *puVar10;
  DdNode *pDVar11;
  uint *puVar12;
  uint uVar13;
  uint index;
  DdNode *pDVar14;
  DdNode *local_60;
  
  pDVar6 = manager->one;
  pDVar14 = (DdNode *)((ulong)pDVar6 ^ 1);
  if (((((DdNode *)((ulong)g ^ 1) == f) || (pDVar14 == f)) || (pDVar14 == g)) ||
     (pDVar14 = pDVar6, pDVar6 == g && pDVar6 == f)) {
    return pDVar14;
  }
  if (pDVar6 != cube) {
    pDVar14 = g;
    if ((f == g || pDVar6 == f) || (pDVar14 = f, pDVar6 == g)) {
      pDVar6 = cuddBddExistAbstractRecur(manager,pDVar14,cube);
      return pDVar6;
    }
    if (g < f) {
      pDVar14 = g;
      g = f;
    }
    f = pDVar14;
    puVar12 = (uint *)((ulong)f & 0xfffffffffffffffe);
    puVar10 = (uint *)((ulong)g & 0xfffffffffffffffe);
    piVar4 = manager->perm;
    uVar1 = piVar4[*puVar12];
    uVar2 = piVar4[*puVar10];
    uVar13 = uVar1;
    if (uVar2 < uVar1) {
      uVar13 = uVar2;
    }
    do {
      uVar3 = piVar4[cube->index];
      if (uVar13 <= uVar3) {
        if (((puVar12[1] != 1) || (puVar10[1] != 1)) &&
           (pDVar14 = cuddCacheLookup(manager,6,f,g,cube), pDVar14 != (DdNode *)0x0)) {
          return pDVar14;
        }
        if ((manager->TimeStop != 0) && (aVar7 = Abc_Clock(), manager->TimeStop < aVar7)) {
          return (DdNode *)0x0;
        }
        if (uVar2 < uVar1) {
          index = *puVar10;
          pDVar14 = f;
          local_60 = f;
        }
        else {
          index = *puVar12;
          pDVar14 = *(DdNode **)(puVar12 + 4);
          local_60 = *(DdNode **)(puVar12 + 6);
          if (((ulong)f & 1) != 0) {
            pDVar14 = (DdNode *)((ulong)pDVar14 ^ 1);
            local_60 = (DdNode *)((ulong)local_60 ^ 1);
          }
        }
        pDVar9 = g;
        pDVar11 = g;
        if (uVar2 <= uVar1) {
          pDVar11 = *(DdNode **)(puVar10 + 4);
          pDVar9 = *(DdNode **)(puVar10 + 6);
          if (((ulong)g & 1) != 0) {
            pDVar11 = (DdNode *)((ulong)pDVar11 ^ 1);
            pDVar9 = (DdNode *)((ulong)pDVar9 ^ 1);
          }
        }
        if (uVar3 == uVar13) {
          pDVar8 = (cube->type).kids.T;
          pDVar14 = cuddBddAndAbstractRecur(manager,pDVar14,pDVar11,pDVar8);
          if (pDVar14 == (DdNode *)0x0) {
            pDVar6 = (DdNode *)0x0;
            bVar5 = false;
            pDVar14 = (DdNode *)0x0;
          }
          else if (((pDVar14 == pDVar6) || (pDVar14 == local_60)) || (pDVar14 == pDVar9)) {
            if ((puVar12[1] != 1) || (puVar10[1] != 1)) {
              cuddCacheInsert(manager,6,f,g,cube,pDVar14);
            }
            bVar5 = false;
            pDVar6 = (DdNode *)0x0;
          }
          else {
            piVar4 = (int *)(((ulong)pDVar14 & 0xfffffffffffffffe) + 4);
            *piVar4 = *piVar4 + 1;
            pDVar6 = pDVar9;
            if ((pDVar14 == (DdNode *)((ulong)local_60 ^ 1)) ||
               (pDVar6 = local_60, pDVar14 == (DdNode *)((ulong)pDVar9 ^ 1))) {
              pDVar11 = cuddBddExistAbstractRecur(manager,pDVar6,pDVar8);
            }
            else {
              pDVar11 = cuddBddAndAbstractRecur(manager,local_60,pDVar9,pDVar8);
            }
            if (pDVar11 == (DdNode *)0x0) {
              Cudd_IterDerefBdd(manager,pDVar14);
              pDVar6 = (DdNode *)0x0;
              bVar5 = false;
              pDVar14 = (DdNode *)0x0;
            }
            else if (pDVar14 == pDVar11) {
              piVar4 = (int *)(((ulong)pDVar14 & 0xfffffffffffffffe) + 4);
              *piVar4 = *piVar4 + -1;
              bVar5 = true;
              pDVar6 = pDVar14;
            }
            else {
              piVar4 = (int *)(((ulong)pDVar11 & 0xfffffffffffffffe) + 4);
              *piVar4 = *piVar4 + 1;
              pDVar9 = cuddBddAndRecur(manager,(DdNode *)((ulong)pDVar14 ^ 1),
                                       (DdNode *)((ulong)pDVar11 ^ 1));
              if (pDVar9 == (DdNode *)0x0) {
                Cudd_IterDerefBdd(manager,pDVar14);
                Cudd_IterDerefBdd(manager,pDVar11);
                pDVar6 = (DdNode *)0x0;
                pDVar8 = (DdNode *)0x0;
              }
              else {
                pDVar6 = (DdNode *)((ulong)pDVar9 ^ 1);
                pDVar8 = (DdNode *)((ulong)pDVar9 & 0xfffffffffffffffe);
                pDVar8->ref = pDVar8->ref + 1;
                Cudd_DelayedDerefBdd(manager,pDVar14);
                Cudd_DelayedDerefBdd(manager,pDVar11);
                pDVar8->ref = pDVar8->ref - 1;
              }
              bVar5 = pDVar9 != (DdNode *)0x0;
              pDVar14 = pDVar8;
            }
          }
          if (!bVar5) {
            return pDVar14;
          }
        }
        else {
          pDVar14 = cuddBddAndAbstractRecur(manager,pDVar14,pDVar11,cube);
          if (pDVar14 == (DdNode *)0x0) {
            return (DdNode *)0x0;
          }
          pDVar8 = (DdNode *)((ulong)pDVar14 & 0xfffffffffffffffe);
          pDVar8->ref = pDVar8->ref + 1;
          pDVar11 = cuddBddAndAbstractRecur(manager,local_60,pDVar9,cube);
          if (pDVar11 == (DdNode *)0x0) goto LAB_007f9cd1;
          pDVar6 = pDVar14;
          if (pDVar14 != pDVar11) {
            piVar4 = (int *)(((ulong)pDVar11 & 0xfffffffffffffffe) + 4);
            *piVar4 = *piVar4 + 1;
            if (((ulong)pDVar14 & 1) == 0) {
              pDVar6 = cuddUniqueInter(manager,index,pDVar14,pDVar11);
              if (pDVar6 == (DdNode *)0x0) {
                Cudd_IterDerefBdd(manager,pDVar14);
                pDVar14 = pDVar11;
LAB_007f9cd1:
                Cudd_IterDerefBdd(manager,pDVar14);
                return (DdNode *)0x0;
              }
            }
            else {
              pDVar6 = cuddUniqueInter(manager,index,pDVar8,(DdNode *)((ulong)pDVar11 ^ 1));
              if (pDVar6 == (DdNode *)0x0) {
                Cudd_IterDerefBdd(manager,pDVar14);
                pDVar14 = pDVar11;
                goto LAB_007f9cd1;
              }
              pDVar6 = (DdNode *)((ulong)pDVar6 ^ 1);
            }
            piVar4 = (int *)(((ulong)pDVar11 & 0xfffffffffffffffe) + 4);
            *piVar4 = *piVar4 + -1;
          }
          pDVar8->ref = pDVar8->ref - 1;
        }
        if ((puVar12[1] == 1) && (puVar10[1] == 1)) {
          return pDVar6;
        }
        cuddCacheInsert(manager,6,f,g,cube,pDVar6);
        return pDVar6;
      }
      cube = (cube->type).kids.T;
    } while (cube != pDVar6);
  }
  pDVar6 = cuddBddAndRecur(manager,f,g);
  return pDVar6;
}

Assistant:

DdNode *
cuddBddAndAbstractRecur(
  DdManager * manager,
  DdNode * f,
  DdNode * g,
  DdNode * cube)
{
    DdNode *F, *ft, *fe, *G, *gt, *ge;
    DdNode *one, *zero, *r, *t, *e;
    unsigned int topf, topg, topcube, top, index;

    statLine(manager);
    one = DD_ONE(manager);
    zero = Cudd_Not(one);

    /* Terminal cases. */
    if (f == zero || g == zero || f == Cudd_Not(g)) return(zero);
    if (f == one && g == one)   return(one);

    if (cube == one) {
        return(cuddBddAndRecur(manager, f, g));
    }
    if (f == one || f == g) {
        return(cuddBddExistAbstractRecur(manager, g, cube));
    }
    if (g == one) {
        return(cuddBddExistAbstractRecur(manager, f, cube));
    }
    /* At this point f, g, and cube are not constant. */

    if (f > g) { /* Try to increase cache efficiency. */
        DdNode *tmp = f;
        f = g;
        g = tmp;
    }

    /* Here we can skip the use of cuddI, because the operands are known
    ** to be non-constant.
    */
    F = Cudd_Regular(f);
    G = Cudd_Regular(g);
    topf = manager->perm[F->index];
    topg = manager->perm[G->index];
    top = ddMin(topf, topg);
    topcube = manager->perm[cube->index];

    while (topcube < top) {
        cube = cuddT(cube);
        if (cube == one) {
            return(cuddBddAndRecur(manager, f, g));
        }
        topcube = manager->perm[cube->index];
    }
    /* Now, topcube >= top. */

    /* Check cache. */
    if (F->ref != 1 || G->ref != 1) {
        r = cuddCacheLookup(manager, DD_BDD_AND_ABSTRACT_TAG, f, g, cube);
        if (r != NULL) {
            return(r);
        }
    }

    if ( manager->TimeStop && Abc_Clock() > manager->TimeStop )
        return NULL;

    if (topf == top) {
        index = F->index;
        ft = cuddT(F);
        fe = cuddE(F);
        if (Cudd_IsComplement(f)) {
            ft = Cudd_Not(ft);
            fe = Cudd_Not(fe);
        }
    } else {
        index = G->index;
        ft = fe = f;
    }

    if (topg == top) {
        gt = cuddT(G);
        ge = cuddE(G);
        if (Cudd_IsComplement(g)) {
            gt = Cudd_Not(gt);
            ge = Cudd_Not(ge);
        }
    } else {
        gt = ge = g;
    }

    if (topcube == top) {       /* quantify */
        DdNode *Cube = cuddT(cube);
        t = cuddBddAndAbstractRecur(manager, ft, gt, Cube);
        if (t == NULL) return(NULL);
        /* Special case: 1 OR anything = 1. Hence, no need to compute
        ** the else branch if t is 1. Likewise t + t * anything == t.
        ** Notice that t == fe implies that fe does not depend on the
        ** variables in Cube. Likewise for t == ge.
        */
        if (t == one || t == fe || t == ge) {
            if (F->ref != 1 || G->ref != 1)
                cuddCacheInsert(manager, DD_BDD_AND_ABSTRACT_TAG,
                                f, g, cube, t);
            return(t);
        }
        cuddRef(t);
        /* Special case: t + !t * anything == t + anything. */
        if (t == Cudd_Not(fe)) {
            e = cuddBddExistAbstractRecur(manager, ge, Cube);
        } else if (t == Cudd_Not(ge)) {
            e = cuddBddExistAbstractRecur(manager, fe, Cube);
        } else {
            e = cuddBddAndAbstractRecur(manager, fe, ge, Cube);
        }
        if (e == NULL) {
            Cudd_IterDerefBdd(manager, t);
            return(NULL);
        }
        if (t == e) {
            r = t;
            cuddDeref(t);
        } else {
            cuddRef(e);
            r = cuddBddAndRecur(manager, Cudd_Not(t), Cudd_Not(e));
            if (r == NULL) {
                Cudd_IterDerefBdd(manager, t);
                Cudd_IterDerefBdd(manager, e);
                return(NULL);
            }
            r = Cudd_Not(r);
            cuddRef(r);
            Cudd_DelayedDerefBdd(manager, t);
            Cudd_DelayedDerefBdd(manager, e);
            cuddDeref(r);
        }
    } else {
        t = cuddBddAndAbstractRecur(manager, ft, gt, cube);
        if (t == NULL) return(NULL);
        cuddRef(t);
        e = cuddBddAndAbstractRecur(manager, fe, ge, cube);
        if (e == NULL) {
            Cudd_IterDerefBdd(manager, t);
            return(NULL);
        }
        if (t == e) {
            r = t;
            cuddDeref(t);
        } else {
            cuddRef(e);
            if (Cudd_IsComplement(t)) {
                r = cuddUniqueInter(manager, (int) index,
                                    Cudd_Not(t), Cudd_Not(e));
                if (r == NULL) {
                    Cudd_IterDerefBdd(manager, t);
                    Cudd_IterDerefBdd(manager, e);
                    return(NULL);
                }
                r = Cudd_Not(r);
            } else {
                r = cuddUniqueInter(manager,(int)index,t,e);
                if (r == NULL) {
                    Cudd_IterDerefBdd(manager, t);
                    Cudd_IterDerefBdd(manager, e);
                    return(NULL);
                }
            }
            cuddDeref(e);
            cuddDeref(t);
        }
    }

    if (F->ref != 1 || G->ref != 1)
        cuddCacheInsert(manager, DD_BDD_AND_ABSTRACT_TAG, f, g, cube, r);
    return (r);

}